

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client)

{
  ListOfUnacknowledgedNotifications *pLVar1;
  int iVar2;
  ulong *puVar3;
  UA_Client_NotificationsAckNumber *pUVar4;
  bool bVar5;
  UA_StatusCode UVar6;
  UA_Client_MonitoredItem *pUVar7;
  UA_Client_NotificationsAckNumber *pUVar8;
  UA_UInt32 *pUVar9;
  long lVar10;
  UA_ExtensionObject *pUVar11;
  ulong uVar12;
  UA_DiagnosticInfo **ppUVar13;
  undefined8 *puVar14;
  ulong uVar15;
  byte bVar16;
  UA_Client_Subscription *pUVar17;
  byte bVar18;
  undefined8 local_230 [16];
  undefined1 local_1b0 [8];
  UA_PublishResponse response;
  UA_ExtensionObject *local_58;
  void *pvStack_50;
  
  bVar18 = 0;
  UVar6 = 0x800d0000;
  if (client->state != UA_CLIENTSTATE_ERRORED) {
    pLVar1 = &client->pendingNotificationsAcks;
    bVar16 = 1;
    do {
      if ((bVar16 & 1) == 0) break;
      local_58 = (UA_ExtensionObject *)0x0;
      pvStack_50 = (void *)0x0;
      response.diagnosticInfos = (UA_DiagnosticInfo *)0x0;
      pUVar8 = pLVar1->lh_first;
      if (pUVar8 != (UA_Client_NotificationsAckNumber *)0x0) {
        local_58 = (UA_ExtensionObject *)0x0;
        do {
          local_58 = (UA_ExtensionObject *)((long)&local_58->encoding + 1);
          pUVar8 = (pUVar8->listEntry).le_next;
        } while (pUVar8 != (UA_Client_NotificationsAckNumber *)0x0);
      }
      if ((local_58 == (UA_ExtensionObject *)0x0) ||
         (pvStack_50 = malloc((long)local_58 << 3), pvStack_50 != (void *)0x0)) {
        pUVar8 = pLVar1->lh_first;
        if (pUVar8 != (UA_Client_NotificationsAckNumber *)0x0) {
          pUVar9 = (UA_UInt32 *)((long)pvStack_50 + 4);
          do {
            *pUVar9 = (pUVar8->subAck).sequenceNumber;
            pUVar9[-1] = (pUVar8->subAck).subscriptionId;
            pUVar8 = (pUVar8->listEntry).le_next;
            pUVar9 = pUVar9 + 2;
          } while (pUVar8 != (UA_Client_NotificationsAckNumber *)0x0);
        }
        ppUVar13 = &response.diagnosticInfos;
        puVar14 = local_230;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar14 = *ppUVar13;
          ppUVar13 = ppUVar13 + (ulong)bVar18 * -2 + 1;
          puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
        }
        __UA_Client_Service(client,local_230,UA_TYPES + 0x6f,local_1b0,UA_TYPES + 0x4e);
        pUVar17 = (UA_Client_Subscription *)&client->subscriptions;
        if (response.responseHeader.timestamp._4_4_ == 0) {
          do {
            pUVar17 = (pUVar17->listEntry).le_next;
            if (pUVar17 == (UA_Client_Subscription *)0x0) goto LAB_001295ba;
          } while (pUVar17->subscriptionID !=
                   response.responseHeader.additionalHeader.content._32_4_);
          if (response.notificationMessage.notificationData != (UA_ExtensionObject *)0x0) {
            pUVar11 = (UA_ExtensionObject *)0x0;
            do {
              if (local_58 <= pUVar11) break;
              iVar2 = *(int *)(response.resultsSize + (long)pUVar11 * 4);
              if (((iVar2 == 0) || (iVar2 == -0x7f860000)) &&
                 (pUVar8 = pLVar1->lh_first, pUVar8 != (UA_Client_NotificationsAckNumber *)0x0)) {
                do {
                  if (((pUVar8->subAck).subscriptionId ==
                       *(UA_UInt32 *)((long)pvStack_50 + (long)pUVar11 * 8)) &&
                     ((pUVar8->subAck).sequenceNumber ==
                      *(UA_UInt32 *)((long)pvStack_50 + (long)pUVar11 * 8 + 4))) {
                    pUVar4 = (pUVar8->listEntry).le_next;
                    if (pUVar4 != (UA_Client_NotificationsAckNumber *)0x0) {
                      (pUVar4->listEntry).le_prev = (pUVar8->listEntry).le_prev;
                    }
                    *(pUVar8->listEntry).le_prev = pUVar4;
                    free(pUVar8);
                    if (pUVar8 == pLVar1->lh_first) {
                      __assert_fail("ack != ((&client->pendingNotificationsAcks)->lh_first)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                                    ,0x671e,
                                    "void UA_Client_processPublishResponse(UA_Client *, UA_PublishRequest *, UA_PublishResponse *)"
                                   );
                    }
                    break;
                  }
                  pUVar8 = (pUVar8->listEntry).le_next;
                } while (pUVar8 != (UA_Client_NotificationsAckNumber *)0x0);
              }
              pUVar11 = (UA_ExtensionObject *)((long)&pUVar11->encoding + 1);
            } while (pUVar11 < response.notificationMessage.notificationData);
          }
          if (response.notificationMessage.publishTime != 0) {
            uVar12 = 0;
            do {
              if (((*(int *)(response.notificationMessage.notificationDataSize + uVar12 * 0x30) == 3
                   ) && (lVar10 = response.notificationMessage.notificationDataSize + uVar12 * 0x30,
                        *(long *)(lVar10 + 8) == 0x1408e0)) &&
                 (puVar3 = *(ulong **)(lVar10 + 0x10), *puVar3 != 0)) {
                uVar15 = 0;
                do {
                  pUVar9 = (UA_UInt32 *)(uVar15 * 0x68 + puVar3[1]);
                  pUVar7 = (UA_Client_MonitoredItem *)&pUVar17->monitoredItems;
                  do {
                    pUVar7 = (pUVar7->listEntry).le_next;
                    if (pUVar7 == (UA_Client_MonitoredItem *)0x0) goto LAB_00129745;
                  } while (pUVar7->clientHandle != *pUVar9);
                  (*pUVar7->handler)(pUVar7->monitoredItemId,(UA_DataValue *)(pUVar9 + 2),
                                     pUVar7->handlerContext);
LAB_00129745:
                  uVar15 = uVar15 + 1;
                } while (uVar15 < *puVar3);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < (ulong)response.notificationMessage.publishTime);
          }
          pUVar8 = (UA_Client_NotificationsAckNumber *)malloc(0x18);
          if (pUVar8 == (UA_Client_NotificationsAckNumber *)0x0) {
            UA_LOG_WARNING((client->config).logger,UA_LOGCATEGORY_CLIENT,
                           "Not enough memory to store the acknowledgement for a publish message on subscription %u"
                          );
          }
          else {
            (pUVar8->subAck).sequenceNumber = response._160_4_;
            (pUVar8->subAck).subscriptionId = pUVar17->subscriptionID;
            pUVar4 = pLVar1->lh_first;
            (pUVar8->listEntry).le_next = pUVar4;
            if (pUVar4 != (UA_Client_NotificationsAckNumber *)0x0) {
              (pUVar4->listEntry).le_prev = (UA_Client_NotificationsAckNumber **)pUVar8;
            }
            pLVar1->lh_first = pUVar8;
            (pUVar8->listEntry).le_prev = &pLVar1->lh_first;
          }
        }
LAB_001295ba:
        bVar16 = (byte)response.availableSequenceNumbers;
        deleteMembers_noInit(local_1b0,UA_TYPES + 0x4e);
        memset(local_1b0,0,0xe8);
        deleteMembers_noInit(&response.diagnosticInfos,UA_TYPES + 0x6f);
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
    } while (bVar5);
    UVar6 = 0;
  }
  return UVar6;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client) {
    if (client->state == UA_CLIENTSTATE_ERRORED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_Boolean moreNotifications = true;
    while(moreNotifications) {
        UA_PublishRequest request;
        UA_PublishRequest_init(&request);
        request.subscriptionAcknowledgementsSize = 0;

        UA_Client_NotificationsAckNumber *ack;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry)
            ++request.subscriptionAcknowledgementsSize;
        if(request.subscriptionAcknowledgementsSize > 0) {
            request.subscriptionAcknowledgements =
                UA_malloc(sizeof(UA_SubscriptionAcknowledgement) * request.subscriptionAcknowledgementsSize);
            if(!request.subscriptionAcknowledgements)
                return UA_STATUSCODE_GOOD;
        }

        int i = 0;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry) {
            request.subscriptionAcknowledgements[i].sequenceNumber = ack->subAck.sequenceNumber;
            request.subscriptionAcknowledgements[i].subscriptionId = ack->subAck.subscriptionId;
            ++i;
        }

        UA_PublishResponse response = UA_Client_Service_publish(client, request);
        UA_Client_processPublishResponse(client, &request, &response);
        moreNotifications = response.moreNotifications;

        UA_PublishResponse_deleteMembers(&response);
        UA_PublishRequest_deleteMembers(&request);
    }
    return UA_STATUSCODE_GOOD;
}